

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

void __thiscall Cmd::refreshMultiLine(Cmd *this,State *state)

{
  size_t sVar1;
  bool bVar2;
  int plen;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  string_view str;
  string ab;
  char seq [64];
  
  plen = (int)(this->prompt)._M_string_length;
  lVar4 = (long)plen;
  uVar6 = state->cols;
  iVar3 = (int)state->maxrows;
  ab._M_dataplus._M_p = (pointer)&ab.field_2;
  ab._M_string_length = 0;
  ab.field_2._M_local_buf[0] = '\0';
  iVar8 = (int)((((state->buf)._M_string_length + uVar6 + lVar4) - 1) / uVar6);
  if (iVar3 < iVar8) {
    state->maxrows = (long)iVar8;
  }
  if ((int)((uVar6 + lVar4 + state->oldpos) / uVar6) < iVar3) {
    snprintf(seq,0x40,"\x1b[%dB");
    std::__cxx11::string::append((char *)&ab);
  }
  iVar7 = 1;
  if (1 < iVar3) {
    iVar7 = iVar3;
  }
  while (iVar7 = iVar7 + -1, iVar7 != 0) {
    std::__cxx11::string::append((char *)&ab);
  }
  std::__cxx11::string::append((char *)&ab);
  std::__cxx11::string::append((string *)&ab);
  if (state->mask_mode == true) {
    std::__cxx11::string::append((ulong)&ab,(char)(state->buf)._M_string_length);
  }
  else {
    std::__cxx11::string::append((string *)&ab);
  }
  refreshShowHints(this,&ab,state,plen);
  sVar1 = state->pos;
  if (((sVar1 != 0) && (sVar1 == (state->buf)._M_string_length)) &&
     ((sVar1 + lVar4) % state->cols == 0)) {
    std::__cxx11::string::append((char *)&ab);
    iVar3 = iVar8 + 1;
    bVar2 = (int)state->maxrows <= iVar8;
    iVar8 = iVar3;
    if (bVar2) {
      state->maxrows = (long)iVar3;
    }
  }
  uVar5 = state->pos + lVar4;
  uVar6 = state->cols;
  if ((int)((uVar5 + uVar6) / uVar6) < iVar8) {
    snprintf(seq,0x40,"\x1b[%dA");
    std::__cxx11::string::append((char *)&ab);
    uVar6 = state->cols;
    uVar5 = lVar4 + state->pos;
  }
  if ((int)(uVar5 % uVar6) != 0) {
    snprintf(seq,0x40,"\r\x1b[%dC");
  }
  std::__cxx11::string::append((char *)&ab);
  state->oldpos = state->pos;
  str._M_str = ab._M_dataplus._M_p;
  str._M_len = ab._M_string_length;
  write_string(this,str);
  std::__cxx11::string::~string((string *)&ab);
  return;
}

Assistant:

void refreshMultiLine(State *state) {
		char seq[64];
		const int plen     = prompt.size();
		int rows           = (plen + state->buf.size() + state->cols - 1) / state->cols; // rows used by current buf.
		const int rpos     = (plen + state->oldpos + state->cols) / state->cols;         // cursor relative row.
		const int old_rows = state->maxrows;
		std::string ab;

		// Update maxrows if needed.
		if (rows > static_cast<int>(state->maxrows)) {
			state->maxrows = rows;
		}

		// First step: clear all the lines used before. To do so start by going to the last row.
		if (old_rows - rpos > 0) {
			snprintf(seq, sizeof(seq), "\x1b[%dB", old_rows - rpos);
			ab.append(seq);
		}

		// Now for every row clear it, go up.
		for (int j = 0; j < old_rows - 1; j++) {
			ab.append("\r\x1b[0K\x1b[1A");
		}

		// Clean the top line.
		ab.append("\r\x1b[0K");

		// Write the prompt and the current buffer content
		ab.append(prompt);
		if (state->mask_mode) {
			ab.append(state->buf.size(), '*');
		} else {
			ab.append(state->buf);
		}

		// Show hits if any.
		refreshShowHints(ab, state, plen);

		// If we are at the very end of the screen with our prompt, we need to emit a newline and move the prompt to the first column.
		if (state->pos && state->pos == state->buf.size() && (state->pos + plen) % state->cols == 0) {
			ab.append("\n\r");
			rows++;
			if (rows > static_cast<int>(state->maxrows)) {
				state->maxrows = rows;
			}
		}

		// Move cursor to right position.
		int rpos2 = (plen + state->pos + state->cols) / state->cols; // current cursor relative row.

		// Go up till we reach the expected positon.
		if (rows - rpos2 > 0) {
			snprintf(seq, sizeof(seq), "\x1b[%dA", rows - rpos2);
			ab.append(seq);
		}

		// Set column.
		const int col = (plen + state->pos) % state->cols;
		if (col) {
			snprintf(seq, sizeof(seq), "\r\x1b[%dC", col);
			ab.append(seq);
		} else {
			ab.append("\r");
		}

		state->oldpos = state->pos;

		write_string(ab);
	}